

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

sexp_conflict
sexp_free_pollfds(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict pollfds)

{
  sexp __ptr;
  
  __ptr = (pollfds->value).type.name;
  if (__ptr != (sexp)0x0) {
    free(__ptr);
    (pollfds->value).flonum = 0.0;
    (pollfds->value).type.cpl = (sexp)0x0;
    (pollfds->value).type.slots = (sexp)0x0;
  }
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_free_pollfds (sexp ctx, sexp self, sexp_sint_t n, sexp pollfds) {
  if (sexp_pollfds_fds(pollfds)) {
    free(sexp_pollfds_fds(pollfds));
    sexp_pollfds_fds(pollfds) = NULL;
    sexp_pollfds_num_fds(pollfds) = 0;
    sexp_pollfds_max_fds(pollfds) = 0;
  }
  return SEXP_VOID;
}